

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepcopy.cpp
# Opt level: O2

int __thiscall
ncnn::DeepCopy::forward(DeepCopy *this,Mat *bottom_blob,Mat *top_blob,Option *param_3)

{
  int iVar1;
  void *in_R8;
  Mat MStack_58;
  
  Mat::clone(&MStack_58,(__fn *)bottom_blob,(void *)0x0,(int)param_3,in_R8);
  Mat::operator=(top_blob,&MStack_58);
  Mat::~Mat(&MStack_58);
  if ((top_blob->data == (void *)0x0) || (iVar1 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar1 = -100;
  }
  return iVar1;
}

Assistant:

int DeepCopy::forward(const Mat& bottom_blob, Mat& top_blob, const Option& /*opt*/) const
{
    top_blob = bottom_blob.clone();
    if (top_blob.empty())
        return -100;

    return 0;
}